

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O3

int Gia_ManCexAbstractionRefine
              (Gia_Man_t *pGia,Abc_Cex_t *pCex,int nFfToAddMax,int fTryFour,int fSensePath,
              int fVerbose)

{
  int *__ptr;
  int iVar1;
  Aig_Man_t *p;
  Vec_Int_t *vFlops;
  Vec_Int_t *pVVar2;
  
  if (pGia->vFlopClasses == (Vec_Int_t *)0x0) {
    puts("Gia_ManCexAbstractionRefine(): Abstraction latch map is missing.");
  }
  else {
    iVar1 = fVerbose;
    p = Gia_ManToAig(pGia,0);
    vFlops = Gia_ManClasses2Flops(pGia->vFlopClasses);
    iVar1 = Saig_ManCexRefineStep
                      (p,vFlops,pGia->vFlopClasses,pCex,nFfToAddMax,iVar1,fSensePath,fVerbose);
    if (iVar1 == 0) {
      pGia->pCexSeq = p->pSeqModel;
      p->pSeqModel = (Abc_Cex_t *)0x0;
      if (vFlops->pArray != (int *)0x0) {
        free(vFlops->pArray);
      }
      free(vFlops);
      Aig_ManStop(p);
      return 0;
    }
    pVVar2 = pGia->vFlopClasses;
    __ptr = pVVar2->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(pVVar2);
    pVVar2 = Gia_ManFlops2Classes(pGia,vFlops);
    pGia->vFlopClasses = pVVar2;
    if (vFlops->pArray != (int *)0x0) {
      free(vFlops->pArray);
    }
    free(vFlops);
    Aig_ManStop(p);
  }
  return -1;
}

Assistant:

int Gia_ManCexAbstractionRefine( Gia_Man_t * pGia, Abc_Cex_t * pCex, int nFfToAddMax, int fTryFour, int fSensePath, int fVerbose )
{
    Aig_Man_t * pNew;
    Vec_Int_t * vFlops;
    if ( pGia->vFlopClasses == NULL )
    {
        printf( "Gia_ManCexAbstractionRefine(): Abstraction latch map is missing.\n" );
        return -1;
    }
    pNew = Gia_ManToAig( pGia, 0 );
    vFlops = Gia_ManClasses2Flops( pGia->vFlopClasses );
    if ( !Saig_ManCexRefineStep( pNew, vFlops, pGia->vFlopClasses, pCex, nFfToAddMax, fTryFour, fSensePath, fVerbose ) )
    {
        pGia->pCexSeq = pNew->pSeqModel; pNew->pSeqModel = NULL;
        Vec_IntFree( vFlops );
        Aig_ManStop( pNew );
        return 0;
    }
    Vec_IntFree( pGia->vFlopClasses );
    pGia->vFlopClasses = Gia_ManFlops2Classes( pGia, vFlops );
    Vec_IntFree( vFlops );
    Aig_ManStop( pNew );
    return -1;
}